

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_round(Context *context,IntrinsicResult partialResult)

{
  int32_t iVar1;
  Value *value;
  double dVar2;
  undefined1 local_78 [16];
  double local_68;
  String local_60;
  String local_50;
  Value local_40;
  Value local_30;
  
  String::String(&local_50,"x");
  Context::GetVar((Context *)local_78,(String *)partialResult.rs,(LocalOnlyMode)&local_50);
  if (local_78[0] != Number) {
    local_78._8_8_ = 0.0;
  }
  Value::~Value((Value *)local_78);
  String::~String(&local_50);
  String::String(&local_60,"decimalPlaces");
  Context::GetVar((Context *)local_78,(String *)partialResult.rs,(LocalOnlyMode)&local_60);
  iVar1 = Value::IntValue((Value *)local_78);
  Value::~Value((Value *)local_78);
  String::~String(&local_60);
  if (iVar1 == 0) {
    local_30.data.number = round((double)local_78._8_8_);
    value = &local_30;
    local_30.type = Number;
    local_30.noInvoke = false;
    local_30.localOnly = Off;
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,value,true);
  }
  else {
    local_68 = pow(10.0,(double)iVar1);
    dVar2 = round((double)local_78._8_8_ * local_68);
    local_40.data.number = dVar2 / local_68;
    value = &local_40;
    local_40.type = Number;
    local_40.noInvoke = false;
    local_40.localOnly = Off;
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,value,true);
  }
  Value::~Value(value);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_round(Context *context, IntrinsicResult partialResult) {
		double num = context->GetVar("x").DoubleValue();
		long decimalPlaces = context->GetVar("decimalPlaces").IntValue();
		if (decimalPlaces == 0) return IntrinsicResult(round(num));	// easy case
		double f = pow(10, decimalPlaces);
		return IntrinsicResult(round(num*f) / f);
	}